

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_matcher.cpp
# Opt level: O2

bool __thiscall
duckdb::ExpressionMatcher::Match
          (ExpressionMatcher *this,Expression *expr,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings)

{
  int iVar1;
  pointer pTVar2;
  pointer pEVar3;
  reference_wrapper<duckdb::Expression> local_20;
  
  if ((this->type).super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>.
      _M_t.super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>.
      _M_t.super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
      super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl != (TypeMatcher *)0x0) {
    pTVar2 = unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true>::
             operator->(&this->type);
    iVar1 = (*pTVar2->_vptr_TypeMatcher[2])(pTVar2,&expr->return_type);
    if ((char)iVar1 == '\0') {
      return false;
    }
  }
  if ((this->expr_type).
      super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
      .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl !=
      (ExpressionTypeMatcher *)0x0) {
    pEVar3 = unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>,_true>
             ::operator->(&this->expr_type);
    iVar1 = (*pEVar3->_vptr_ExpressionTypeMatcher[2])
                      (pEVar3,(ulong)(expr->super_BaseExpression).type);
    if ((char)iVar1 == '\0') {
      return false;
    }
  }
  if ((this->expr_class != INVALID) &&
     (this->expr_class != (expr->super_BaseExpression).expression_class)) {
    return false;
  }
  local_20._M_data = expr;
  ::std::
  vector<std::reference_wrapper<duckdb::Expression>,std::allocator<std::reference_wrapper<duckdb::Expression>>>
  ::emplace_back<std::reference_wrapper<duckdb::Expression>>
            ((vector<std::reference_wrapper<duckdb::Expression>,std::allocator<std::reference_wrapper<duckdb::Expression>>>
              *)bindings,&local_20);
  return true;
}

Assistant:

bool ExpressionMatcher::Match(Expression &expr, vector<reference<Expression>> &bindings) {
	if (type && !type->Match(expr.return_type)) {
		return false;
	}
	if (expr_type && !expr_type->Match(expr.GetExpressionType())) {
		return false;
	}
	if (expr_class != ExpressionClass::INVALID && expr_class != expr.GetExpressionClass()) {
		return false;
	}
	bindings.push_back(expr);
	return true;
}